

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixie_provider.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::PixieProvider::OnDataDictionary
          (PixieProvider *this,DataDictionaryMessage *dict_message)

{
  pointer *__u;
  bool bVar1;
  element_type *peVar2;
  type pIVar3;
  undefined1 local_a0 [8];
  vector<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
  field_defs_1;
  string local_80;
  undefined1 local_60 [8];
  vector<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
  field_defs;
  string local_38;
  DataDictionaryMessage *local_18;
  DataDictionaryMessage *dict_message_local;
  PixieProvider *this_local;
  
  local_18 = dict_message;
  dict_message_local = (DataDictionaryMessage *)this;
  bVar1 = DataDictionaryMessage::IsUpdate(dict_message);
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)Log);
    DataDictionaryMessage::ToString_abi_cxx11_(&local_38,local_18);
    spdlog::logger::info<std::__cxx11::string>
              (peVar2,"updated current dictionary with new fields: {}",&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    DataDictionaryMessage::GetFieldDefs
              ((vector<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
                *)local_60,local_18);
    pIVar3 = std::
             unique_ptr<bidfx_public_api::price::pixie::IDataDictionary,_std::default_delete<bidfx_public_api::price::pixie::IDataDictionary>_>
             ::operator*(&this->data_dictionary_);
    DataDictionaryUtils::AddAllFields
              (pIVar3,(vector<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
                       *)local_60);
    std::
    vector<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
    ::~vector((vector<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
               *)local_60);
  }
  else {
    peVar2 = std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)Log);
    DataDictionaryMessage::ToString_abi_cxx11_(&local_80,local_18);
    spdlog::logger::info<std::__cxx11::string>(peVar2,"replacing dictionary with: {}",&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    __u = &field_defs_1.
           super__Vector_base<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::make_unique<bidfx_public_api::price::pixie::ExtendableDataDictionary>();
    std::
    unique_ptr<bidfx_public_api::price::pixie::IDataDictionary,std::default_delete<bidfx_public_api::price::pixie::IDataDictionary>>
    ::operator=((unique_ptr<bidfx_public_api::price::pixie::IDataDictionary,std::default_delete<bidfx_public_api::price::pixie::IDataDictionary>>
                 *)&this->data_dictionary_,
                (unique_ptr<bidfx_public_api::price::pixie::ExtendableDataDictionary,_std::default_delete<bidfx_public_api::price::pixie::ExtendableDataDictionary>_>
                 *)__u);
    std::
    unique_ptr<bidfx_public_api::price::pixie::ExtendableDataDictionary,_std::default_delete<bidfx_public_api::price::pixie::ExtendableDataDictionary>_>
    ::~unique_ptr((unique_ptr<bidfx_public_api::price::pixie::ExtendableDataDictionary,_std::default_delete<bidfx_public_api::price::pixie::ExtendableDataDictionary>_>
                   *)__u);
    DataDictionaryMessage::GetFieldDefs
              ((vector<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
                *)local_a0,local_18);
    pIVar3 = std::
             unique_ptr<bidfx_public_api::price::pixie::IDataDictionary,_std::default_delete<bidfx_public_api::price::pixie::IDataDictionary>_>
             ::operator*(&this->data_dictionary_);
    DataDictionaryUtils::AddAllFields
              (pIVar3,(vector<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
                       *)local_a0);
    std::
    vector<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
    ::~vector((vector<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
               *)local_a0);
  }
  return;
}

Assistant:

void PixieProvider::OnDataDictionary(DataDictionaryMessage& dict_message)
{
    if (dict_message.IsUpdate())
    {
        Log->info("updated current dictionary with new fields: {}", dict_message.ToString());
        auto field_defs = dict_message.GetFieldDefs();
        DataDictionaryUtils::AddAllFields(*data_dictionary_, field_defs);
    }
    else
    {
        Log->info("replacing dictionary with: {}", dict_message.ToString());
        data_dictionary_ = std::make_unique<ExtendableDataDictionary>();
        auto field_defs = dict_message.GetFieldDefs();
        DataDictionaryUtils::AddAllFields(*data_dictionary_, field_defs);
    }
}